

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

bool __thiscall QWidgetPrivate::isAboutToShow(QWidgetPrivate *this)

{
  long lVar1;
  
  while( true ) {
    if (((this->data).field_0x11 & 4) != 0) {
      return true;
    }
    if (((*(byte *)(*(long *)(*(long *)&this->field_0x8 + 0x20) + 10) & 1) != 0) ||
       (lVar1 = *(long *)(*(long *)(*(long *)&this->field_0x8 + 8) + 0x10), lVar1 == 0)) break;
    this = *(QWidgetPrivate **)(lVar1 + 8);
  }
  return false;
}

Assistant:

bool QWidgetPrivate::isAboutToShow() const
{
    if (data.in_show)
        return true;

    Q_Q(const QWidget);
    if (q->isHidden())
        return false;

    // The widget will be shown if any of its ancestors are about to show.
    QWidget *parent = q->parentWidget();
    return parent ? parent->d_func()->isAboutToShow() : false;
}